

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O1

BindingAlias *
duckdb::Binding::GetAlias
          (BindingAlias *__return_storage_ptr__,string *explicit_alias,
          optional_ptr<duckdb::StandardEntry,_true> entry)

{
  pointer pcVar1;
  InternalException *this;
  optional_ptr<duckdb::StandardEntry,_true> local_68;
  string local_60;
  string local_40;
  
  local_68.ptr = entry.ptr;
  if (explicit_alias->_M_string_length == 0) {
    if (entry.ptr == (StandardEntry *)0x0) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "Binding::GetAlias called - but neither an alias nor an entry was provided","");
      InternalException::InternalException(this,&local_60);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_ptr<duckdb::StandardEntry,_true>::CheckValid(&local_68);
    BindingAlias::BindingAlias(__return_storage_ptr__,local_68.ptr);
  }
  else {
    pcVar1 = (explicit_alias->_M_dataplus)._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + explicit_alias->_M_string_length);
    BindingAlias::BindingAlias(__return_storage_ptr__,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BindingAlias Binding::GetAlias(const string &explicit_alias, optional_ptr<StandardEntry> entry) {
	if (!explicit_alias.empty()) {
		return BindingAlias(explicit_alias);
	}
	if (!entry) {
		throw InternalException("Binding::GetAlias called - but neither an alias nor an entry was provided");
	}
	// no explicit alias provided - generate from entry
	return BindingAlias(*entry);
}